

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O0

void __thiscall RegressionTree::regressionTreeQueries(RegressionTree *this)

{
  initializer_list<Aggregate_*> __l;
  initializer_list<Aggregate_*> __l_00;
  initializer_list<Aggregate_*> __l_01;
  bool bVar1;
  void *pvVar2;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *pvVar3;
  Query *pQVar4;
  element_type *peVar5;
  QueryCompiler *pQVar6;
  value_type *pvVar7;
  long in_RDI;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *pvVar8;
  QueryThresholdPair qtPair_1;
  Query *query_1;
  Aggregate *aggQ_complement;
  Aggregate *aggL_complement;
  Aggregate *aggC_complement;
  Aggregate *aggQ_1;
  Aggregate *aggL_1;
  Aggregate *aggC_1;
  size_t f;
  QueryThresholdPair qtPair;
  Query *query;
  Aggregate *aggQ;
  Aggregate *aggL;
  Aggregate *aggC;
  size_t var;
  Query *countQuery;
  Aggregate *countQ;
  Aggregate *countL;
  Aggregate *countC;
  Query *in_stack_fffffffffffffce8;
  QueryCompiler *in_stack_fffffffffffffcf0;
  value_type *in_stack_fffffffffffffcf8;
  bitset<1500UL> *in_stack_fffffffffffffd00;
  iterator in_stack_fffffffffffffd08;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *in_stack_fffffffffffffd10;
  QueryThresholdPair local_1a0;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_180;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_178;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_170;
  QueryCompiler *local_168;
  value_type *local_160;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_158;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> **local_150;
  undefined8 local_148;
  Query *local_140;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_138;
  value_type *local_130;
  QueryCompiler *local_128;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_120;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_118;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_110;
  reference local_108;
  ulong local_f8;
  QueryThresholdPair local_f0;
  void *local_d0;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_c8;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_c0;
  void **local_b8;
  undefined8 local_b0;
  Query *local_a8;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_a0;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_98;
  void *local_90;
  reference local_88;
  reference local_78;
  ulong local_68;
  void *local_60;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_58;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_50;
  void **local_48;
  undefined8 local_40;
  Query *local_38;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_30;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_28;
  void *local_10;
  
  pvVar2 = operator_new(0x30);
  Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
  local_10 = pvVar2;
  pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)operator_new(0x30);
  Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
  local_28 = pvVar3;
  pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)operator_new(0x30);
  Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
  pvVar8 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)(in_RDI + 0x130);
  local_30 = pvVar3;
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[](pvVar8,100);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[](pvVar8,100);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[](local_28,0);
  std::bitset<1500UL>::set
            (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
             SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[](pvVar8,100);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[](local_30,0);
  std::bitset<1500UL>::set
            (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
             SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
  pQVar4 = (Query *)operator_new(0x30);
  Query::Query((Query *)in_stack_fffffffffffffcf0);
  local_38 = pQVar4;
  peVar5 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x208360);
  local_38->_rootID = peVar5->_root->_id;
  local_60 = local_10;
  local_58 = local_28;
  local_50 = local_30;
  local_48 = &local_60;
  local_40 = 3;
  __l._M_len = (size_type)in_stack_fffffffffffffd10;
  __l._M_array = in_stack_fffffffffffffd08;
  std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator=
            ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)in_stack_fffffffffffffd00,__l);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2083f0);
  QueryCompiler::addQuery(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  for (local_68 = 0; local_68 < 100; local_68 = local_68 + 1) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffcf0);
    std::bitset<100UL>::reference::~reference(&local_78);
    if (bVar1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffcf0);
      std::bitset<100UL>::reference::~reference(&local_88);
      if (bVar1) {
        pvVar2 = operator_new(0x30);
        Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
        local_90 = pvVar2;
        pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 operator_new(0x30);
        Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
        local_98 = pvVar3;
        pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 operator_new(0x30);
        Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
        pvVar8 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 (in_RDI + 0x130);
        local_a0 = pvVar3;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                  (pvVar8,100);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                   in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                  (pvVar8,100);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                   in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                  (local_98,0);
        std::bitset<1500UL>::set
                  (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                   SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                  (pvVar8,100);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                   in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                  (local_a0,0);
        std::bitset<1500UL>::set
                  (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                   SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
        pQVar4 = (Query *)operator_new(0x30);
        Query::Query((Query *)in_stack_fffffffffffffcf0);
        pQVar4->_rootID = *(size_t *)(*(long *)(in_RDI + 0x128) + local_68 * 8);
        local_d0 = local_90;
        local_c8 = local_98;
        local_c0 = local_a0;
        local_b8 = &local_d0;
        local_b0 = 3;
        __l_00._M_len = (size_type)in_stack_fffffffffffffd10;
        __l_00._M_array = in_stack_fffffffffffffd08;
        local_a8 = pQVar4;
        std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator=
                  ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)in_stack_fffffffffffffd00,
                   __l_00);
        std::bitset<100UL>::set
                  ((bitset<100UL> *)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                   SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x208754);
        QueryCompiler::addQuery(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        QueryThresholdPair::QueryThresholdPair(&local_f0);
        local_f0.query = local_a8;
        local_f0.varID = local_68;
        local_f0.function = (Function *)0x0;
        local_f0.complementQuery = local_38;
        *(Query **)(*(long *)(in_RDI + 0xd8) + local_68 * 8) = local_a8;
        std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>::push_back
                  ((vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_> *)
                   in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      }
      else {
        for (local_f8 = 0; local_f8 < 0x5dc; local_f8 = local_f8 + 1) {
          std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                    ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     (in_RDI + 0x130),local_68);
          std::bitset<1500UL>::operator[]
                    ((bitset<1500UL> *)in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
          bVar1 = std::bitset::reference::operator_cast_to_bool
                            ((reference *)in_stack_fffffffffffffcf0);
          std::bitset<1500UL>::reference::~reference(&local_108);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     operator_new(0x30);
            Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
            local_110 = pvVar3;
            pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     operator_new(0x30);
            Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
            local_118 = pvVar3;
            pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     operator_new(0x30);
            Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
            pvVar8 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     (in_RDI + 0x130);
            local_120 = pvVar3;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (pvVar8,100);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (local_110,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (pvVar8,100);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (local_118,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (local_118,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (pvVar8,100);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (local_120,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (local_120,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            pQVar6 = (QueryCompiler *)operator_new(0x30);
            Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
            local_128 = pQVar6;
            pvVar7 = (value_type *)operator_new(0x30);
            Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
            local_130 = pvVar7;
            pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     operator_new(0x30);
            Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffcf0);
            in_stack_fffffffffffffd00 = (bitset<1500UL> *)(in_RDI + 0x130);
            in_stack_fffffffffffffd08 = (iterator)0x64;
            in_stack_fffffffffffffcf0 = local_128;
            local_138 = pvVar3;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,100);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       local_128,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            in_stack_fffffffffffffcf8 = local_130;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffd08);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       local_130,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       local_130,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            in_stack_fffffffffffffd10 = local_138;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffd08);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                       in_stack_fffffffffffffd00,(value_type *)in_stack_fffffffffffffcf8);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (local_138,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                      (local_138,0);
            std::bitset<1500UL>::set
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0));
            pQVar4 = (Query *)operator_new(0x30);
            Query::Query((Query *)in_stack_fffffffffffffcf0);
            pQVar4->_rootID = *(size_t *)(*(long *)(in_RDI + 0x128) + local_68 * 8);
            local_180 = local_110;
            local_178 = local_118;
            local_170 = local_120;
            local_168 = local_128;
            local_160 = local_130;
            local_158 = local_138;
            local_150 = &local_180;
            local_148 = 6;
            __l_01._M_len = (size_type)in_stack_fffffffffffffd10;
            __l_01._M_array = in_stack_fffffffffffffd08;
            local_140 = pQVar4;
            std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator=
                      ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                       in_stack_fffffffffffffd00,__l_01);
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x208ea5);
            QueryCompiler::addQuery(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
            *(Query **)(*(long *)(in_RDI + 0xd8) + local_68 * 8) = local_140;
            QueryThresholdPair::QueryThresholdPair(&local_1a0);
            local_1a0.query = local_140;
            local_1a0.varID = local_68;
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x208f16);
            local_1a0.function =
                 QueryCompiler::getFunction
                           (in_stack_fffffffffffffcf0,(size_t)in_stack_fffffffffffffce8);
            std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>::push_back
                      ((vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_> *)
                       in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RegressionTree::regressionTreeQueries()
{

    Aggregate* countC = new Aggregate();
    Aggregate* countL = new Aggregate();
    Aggregate* countQ = new Aggregate();
                
    /* Q_C */
    countC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                            
    /* Q_L */
    countL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
    countL->_agg[0].set(0);
        
    /* Q_Q */
    countQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
    countQ->_agg[0].set(1);

    // We add an additional query without free vars to compute the
    // complement of each threshold 
    Query* countQuery = new Query();
    countQuery->_rootID = _td->_root->_id;  
    countQuery->_aggregates = {countC,countL,countQ};

    _compiler->addQuery(countQuery);

    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features[var])
        {
            if (_categoricalFeatures[var])
            {
                Aggregate* aggC = new Aggregate();
                Aggregate* aggL = new Aggregate();
                Aggregate* aggQ = new Aggregate();
                
                /* Q_C */
                aggC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                            
                /* Q_L */
                aggL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                aggL->_agg[0].set(0);
        
                /* Q_Q */
                aggQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                aggQ->_agg[0].set(1);

                
                Query* query = new Query();
                query->_rootID = _queryRootIndex[var];  
                query->_aggregates = {aggC,aggL,aggQ};
                query->_fVars.set(var);
                
                _compiler->addQuery(query);


                QueryThresholdPair qtPair;
                qtPair.query = query;
                qtPair.varID = var;
                qtPair.function = nullptr;
                qtPair.complementQuery = countQuery;
                
                _varToQueryMap[var] = query;

                queryToThreshold.push_back(qtPair);
            }
            else /* Continuous Variable */
            {
                /* We create a query for each threshold for this variable */ 
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                {
                    if (!_candidateMask[var][f])
                        continue;
                    
                    Aggregate* aggC = new Aggregate();
                    Aggregate* aggL = new Aggregate();
                    Aggregate* aggQ = new Aggregate();
        
                    /* Q_C */
                    aggC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggC->_agg[0].set(f);

                    /* Q_L */
                    aggL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggL->_agg[0].set(0);
                    aggL->_agg[0].set(f);
        
                    /* Q_Q */
                    aggQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggQ->_agg[0].set(1);
                    aggQ->_agg[0].set(f);
                                        
                    Aggregate* aggC_complement = new Aggregate();
                    Aggregate* aggL_complement = new Aggregate();
                    Aggregate* aggQ_complement = new Aggregate();
        
                    /* Q_C */
                    aggC_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggC_complement->_agg[0].set(_complementFunction[f]);

                    /* Q_L */
                    aggL_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggL_complement->_agg[0].set(0);
                    aggL_complement->_agg[0].set(_complementFunction[f]);
        
                    /* Q_Q */
                    aggQ_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggQ_complement->_agg[0].set(1);
                    aggQ_complement->_agg[0].set(_complementFunction[f]);

                    Query* query = new Query();
                    query->_rootID =  _queryRootIndex[var]; // _td->_root->_id;
                    query->_aggregates = {aggC,aggL,aggQ,
                         aggC_complement,aggL_complement,aggQ_complement};
                    
                    _compiler->addQuery(query);
                    _varToQueryMap[var] = query;
                    
                    QueryThresholdPair qtPair;
                    qtPair.query = query;
                    qtPair.varID = var;
                    qtPair.function = _compiler->getFunction(f);
                    
                    queryToThreshold.push_back(qtPair);
                }
            }
        }
    }
}